

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageTest::Check
          (StorageTest *this,RenderbufferInternalFormatConfiguration format,GLuint width,
          GLuint height)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  float *pfVar4;
  int *piVar5;
  MessageBuilder *pMVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong __n;
  long lVar11;
  float fVar12;
  float fVar13;
  vector<int,_std::allocator<int>_> color;
  undefined4 local_1bc;
  StorageTest *local_1b8;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar2);
  __n = (ulong)(height * width);
  if ((((format.hasRedComponent != false) || (format.hasGreenComponent != false)) ||
      (format.hasBlueComponent != false)) || (format.hasAlphaComponent == true)) {
    uVar8 = (ulong)(height * width * 4);
    if (format.isColorIntegralFormat == true) {
      std::vector<int,_std::allocator<int>_>::vector(&color,uVar8,(allocator_type *)local_1b0);
      (**(code **)(lVar11 + 0x1220))
                (0,0,width,height,0x8d99,0x1404,
                 color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start);
      dVar3 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar3,"glReadPixels call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x200c);
      local_1bc = CONCAT13(format.hasAlphaComponent,
                           CONCAT12(format.hasBlueComponent,
                                    CONCAT11(format.hasGreenComponent,format.hasRedComponent)));
      for (uVar8 = 0; uVar8 != __n; uVar8 = uVar8 + 1) {
        uVar9 = (ulong)((uint)uVar8 & 3);
        if (*(char *)((long)&local_1bc + uVar9) == '\x01') {
          iVar7 = *(int *)(s_reference_color_integer + uVar9 * 4) -
                  color.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          iVar2 = -iVar7;
          if (0 < iVar7) {
            iVar2 = iVar7;
          }
          if (2 < iVar2) {
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),
                            "Renderbuffer storage was cleared with color ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,Check::componentName + uVar9);
            poVar1 = &pMVar6->m_str;
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            " component equal to ");
            std::ostream::_M_insert<void_const*>(poVar1);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ", but fetched value ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,color.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + uVar8);
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " is not the same. Renderbuffers format was ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
            poVar1 = &pMVar6->m_str;
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ", width was ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ", height was ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00b0ddd8;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&color.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&color,uVar8,(allocator_type *)local_1b0);
      local_1b8 = this;
      (**(code **)(lVar11 + 0x1220))
                (0,0,width,height,0x1908,0x1406,
                 color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start);
      dVar3 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar3,"glReadPixels call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x202b);
      local_1bc = CONCAT13(format.hasAlphaComponent,
                           CONCAT12(format.hasBlueComponent,
                                    CONCAT11(format.hasGreenComponent,format.hasRedComponent)));
      for (uVar8 = 0; uVar8 != __n; uVar8 = uVar8 + 1) {
        uVar9 = (ulong)((uint)uVar8 & 3);
        if (*(char *)((long)&local_1bc + uVar9) == '\x01') {
          fVar13 = *(float *)(s_reference_color + uVar9 * 4) -
                   (float)color.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8];
          fVar12 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar12 = fVar13;
          }
          if (0.0625 < fVar12) {
            local_1b0._0_8_ = ((local_1b8->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),
                            "Renderbuffer storage was cleared with color ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,
                                Check(gl4cts::DirectStateAccess::Renderbuffers::StorageTest::RenderbufferInternalFormatConfiguration,unsigned_int,unsigned_int)
                                ::componentName + uVar9);
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " component equal to ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(float *)(s_reference_color + uVar9 * 4));
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            ", but fetched value ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(float *)(color.super__Vector_base<int,_std::allocator<int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar8))
            ;
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " is not the same. Renderbuffers format was ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
            poVar1 = &pMVar6->m_str;
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ", width was ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ", height was ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00b0df01;
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&color);
      this = local_1b8;
    }
  }
  if (format.hasDepthComponent == true) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&color,__n,(allocator_type *)local_1b0);
    (**(code **)(lVar11 + 0x1220))
              (0,0,width,height,0x1902,0x1406,
               color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start);
    dVar3 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar3,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x204c);
    lVar10 = 4;
    pfVar4 = (float *)color.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      if (__n * 4 + lVar10 == 4) {
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&color);
        goto LAB_00b0db60;
      }
      fVar13 = 0.5 - *pfVar4;
      fVar12 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar12 = fVar13;
      }
      lVar10 = lVar10 + -4;
      pfVar4 = pfVar4 + 1;
    } while (fVar12 <= 0.0625);
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),
                    "Renderbuffer storage was cleared with depth component equal to ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(float *)&s_reference_depth);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", but fetched value ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(float *)((long)color.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start - lVar10));
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " is not the same. Renderbuffers format was ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
    poVar1 = &pMVar6->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", width was ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", height was ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b0df01:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&color);
  }
  else {
LAB_00b0db60:
    if (format.hasStencilComponent != true) {
      return true;
    }
    std::vector<int,_std::allocator<int>_>::vector(&color,__n,(allocator_type *)local_1b0);
    (**(code **)(lVar11 + 0x1220))
              (0,0,width,height,0x1901,0x1404,
               color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start);
    dVar3 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar3,"glReadPixels call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x2062);
    lVar11 = 4;
    piVar5 = color.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      if (__n * 4 + lVar11 == 4) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&color.super__Vector_base<int,_std::allocator<int>_>);
        return true;
      }
      lVar11 = lVar11 + -4;
      iVar2 = *piVar5;
      piVar5 = piVar5 + 1;
    } while (iVar2 == 7);
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),
                    "Renderbuffer storage was cleared with alpha component equal to ");
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&s_reference_stencil);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", but fetched value ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(int *)((long)color.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start - lVar11));
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " is not the same. Renderbuffers format was ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&format.internalformat_name);
    poVar1 = &pMVar6->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", width was ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", height was ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b0ddd8:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&color.super__Vector_base<int,_std::allocator<int>_>);
  }
  return false;
}

Assistant:

bool StorageTest::Check(StorageTest::RenderbufferInternalFormatConfiguration format, glw::GLuint width,
						glw::GLuint height)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint size = width * height;

	if (format.hasRedComponent || format.hasGreenComponent || format.hasBlueComponent || format.hasAlphaComponent)
	{
		if (format.isColorIntegralFormat)
		{
			std::vector<glw::GLint> color(size * 4);

			gl.readPixels(0, 0, width, height, GL_RGBA_INTEGER, GL_INT, &color[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

			const bool hasComponent[] = { format.hasRedComponent, format.hasGreenComponent, format.hasBlueComponent,
										  format.hasAlphaComponent };

			static const char* componentName[] = { "red", "green", "blue", "alpha" };

			for (glw::GLuint i = 0; i < size; ++i)
			{
				if (hasComponent[i % 4 /* color components count*/])
				{
					if (de::abs(s_reference_color_integer[i % 4 /* color components count*/] - color[i]) >
						2 /* Precision */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "Renderbuffer storage was cleared with color "
							<< componentName[i % 4 /* color components count*/] << " component equal to "
							<< s_reference_color_integer << ", but fetched value " << color[i]
							<< " is not the same. Renderbuffers format was " << format.internalformat_name
							<< ", width was " << width << ", height was " << height << "." << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
		}
		else
		{
			std::vector<glw::GLfloat> color(size * 4);

			gl.readPixels(0, 0, width, height, GL_RGBA, GL_FLOAT, &color[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

			const bool hasComponent[] = { format.hasRedComponent, format.hasGreenComponent, format.hasBlueComponent,
										  format.hasAlphaComponent };

			static const char* componentName[] = { "red", "green", "blue", "alpha" };

			for (glw::GLuint i = 0; i < size; ++i)
			{
				if (hasComponent[i % 4 /* color components count*/])
				{
					if (de::abs(s_reference_color[i % 4 /* color components count*/] - color[i]) >
						0.0625 /* precision */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "Renderbuffer storage was cleared with color "
							<< componentName[i % 4 /* color components count*/] << " component equal to "
							<< s_reference_color[i % 4 /* color components count*/] << ", but fetched value "
							<< color[i] << " is not the same. Renderbuffers format was " << format.internalformat_name
							<< ", width was " << width << ", height was " << height << "." << tcu::TestLog::EndMessage;

						return false;
					}
				}
			}
		}
	}

	if (format.hasDepthComponent)
	{
		std::vector<glw::GLfloat> depth(size);

		gl.readPixels(0, 0, width, height, GL_DEPTH_COMPONENT, GL_FLOAT, &depth[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

		for (glw::GLuint i = 0; i < size; ++i)
		{
			if (de::abs(s_reference_depth - depth[i]) > 0.0625 /* 1/16 precision */)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage was cleared with depth component equal to "
					<< s_reference_depth << ", but fetched value " << depth[i]
					<< " is not the same. Renderbuffers format was " << format.internalformat_name << ", width was "
					<< width << ", height was " << height << "." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	if (format.hasStencilComponent)
	{
		std::vector<glw::GLint> stencil(size);

		gl.readPixels(0, 0, width, height, GL_STENCIL_INDEX, GL_INT, &stencil[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

		for (glw::GLuint i = 0; i < size; ++i)
		{
			if (s_reference_stencil != stencil[i])
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Renderbuffer storage was cleared with alpha component equal to "
					<< s_reference_stencil << ", but fetched value " << stencil[i]
					<< " is not the same. Renderbuffers format was " << format.internalformat_name << ", width was "
					<< width << ", height was " << height << "." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}